

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O3

ThresholdAlgorithmResult *
topk_algorithms::threshold_algorithm
          (ThresholdAlgorithmResult *__return_storage_ptr__,Problem *problem,RankSize k)

{
  Count *pCVar1;
  Key *pKVar2;
  long lVar3;
  Key KVar4;
  __node_base_ptr key;
  long *plVar5;
  __node_base_ptr p_Var6;
  pointer pKVar7;
  RankSize RVar8;
  _Vector_impl *p_Var9;
  ThresholdAlgorithmResult *pTVar10;
  int iVar11;
  undefined4 extraout_var;
  Queue *pQVar13;
  ulong uVar14;
  pointer pQVar15;
  Rank *pRVar16;
  Value VVar17;
  Count CVar18;
  const_iterator __begin1;
  pointer pQVar19;
  _Vector_base<Queue,_std::allocator<Queue>_> *p_Var20;
  pointer pKVar21;
  pointer pQVar22;
  Rank *pRVar23;
  _Vector_base<Queue,_std::allocator<Queue>_> *p_Var24;
  pointer pQVar25;
  __hash_code __code;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  undefined1 local_d8 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  processed_keys;
  KeyValue local_98;
  Key local_88;
  RankSize *local_78;
  Count local_70;
  RankSize local_68;
  ulong local_60;
  _Vector_base<Queue,_std::allocator<Queue>_> *local_58;
  _Vector_base<Queue,_std::allocator<Queue>_> *local_50;
  pointer local_48;
  ThresholdAlgorithmResult *local_40;
  pointer local_38;
  RankSize *pRVar12;
  
  local_68 = k;
  local_58 = (_Vector_base<Queue,_std::allocator<Queue>_> *)problem;
  iVar11 = (**problem->_vptr_Problem)(problem);
  pRVar12 = (RankSize *)CONCAT44(extraout_var,iVar11);
  if ((RankSize *)0x555555555555555 < pRVar12) {
    std::__throw_length_error("vector::reserve");
  }
  local_40 = __return_storage_ptr__;
  if (pRVar12 == (RankSize *)0x0) {
    pQVar22 = (pointer)0x0;
    local_38 = (pointer)0x0;
    local_48 = (pointer)0x0;
    uVar27 = 0;
    local_70 = 0;
  }
  else {
    local_38 = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate
                         ((_Vector_base<Queue,_std::allocator<Queue>_> *)pRVar12,(size_t)problem);
    pQVar25 = (pointer)((long)local_38 + (long)pRVar12 * 0x18);
    p_Var24 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
    local_70 = 0;
    uVar27 = 0;
    local_48 = (pointer)0x0;
    pQVar19 = local_38;
    local_78 = pRVar12;
    do {
      local_60 = uVar27;
      local_50 = p_Var24;
      pQVar13 = (Queue *)(*(code *)((local_58->_M_impl).super__Vector_impl_data._M_start)->_index)()
      ;
      if (pQVar19 == pQVar25) {
        lVar26 = (long)pQVar19 - (long)local_38;
        if (lVar26 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar14 = (lVar26 >> 3) * -0x5555555555555555;
        uVar27 = uVar14;
        if (pQVar19 == local_38) {
          uVar27 = 1;
        }
        p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)(uVar27 + uVar14);
        if ((_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555554 < p_Var20) {
          p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
        }
        if (CARRY8(uVar27,uVar14)) {
          p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
        }
        pQVar15 = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate
                            (p_Var20,(size_t)p_Var24);
        *(undefined8 *)((long)pQVar15 + lVar26) = 0;
        *(Queue **)((long)pQVar15 + lVar26 + 8) = pQVar13;
        *(undefined8 *)((long)pQVar15 + lVar26 + 0x10) = 0;
        pQVar22 = pQVar15;
        for (pQVar25 = local_38; pQVar19 != pQVar25; pQVar25 = (pointer)&pQVar25[1]._index) {
          pQVar22[1]._rank = pQVar25[1]._rank;
          RVar8 = pQVar25->_index;
          pQVar22->_rank = pQVar25->_rank;
          pQVar22->_index = RVar8;
          pQVar22 = (pointer)&pQVar22[1]._index;
        }
        if (local_38 != (pointer)0x0) {
          operator_delete(local_38);
        }
        pQVar25 = (pointer)((long)pQVar15 + (long)p_Var20 * 0x18);
        pQVar13 = (Queue *)pQVar22->_index;
        pRVar23 = pQVar22[1]._rank;
        local_38 = pQVar15;
      }
      else {
        pQVar19->_rank = (Rank *)0x0;
        pQVar19->_index = (RankSize)pQVar13;
        pQVar19[1]._rank = (Rank *)0x0;
        pRVar23 = (Rank *)0x0;
        pQVar22 = pQVar19;
      }
      pRVar16 = (Rank *)((*(long *)(pQVar13 + 0x10) - *(long *)(pQVar13 + 8) >> 3) *
                        -0x5555555555555555);
      uVar27 = local_60;
      if (pRVar23 <= pRVar16 && (long)pRVar16 - (long)pRVar23 != 0) {
        VVar17 = threshold_algorithm::Queue::head_value(pQVar13);
        pQVar19 = (pointer)((*(long *)(pQVar22->_index + 0x10) - *(long *)(pQVar22->_index + 8) >> 3
                            ) * -0x5555555555555555);
        if (local_48 <= pQVar19) {
          local_48 = pQVar19;
        }
        local_70 = (long)&pQVar19->_rank + local_70;
        pQVar22 = (pointer)&pQVar22[1]._index;
        uVar27 = local_60 + VVar17;
      }
      p_Var24 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                ((long)&(local_50->_M_impl).super__Vector_impl_data._M_start + 1);
      pQVar19 = pQVar22;
    } while (p_Var24 != (_Vector_base<Queue,_std::allocator<Queue>_> *)local_78);
  }
  pTVar10 = local_40;
  local_d8 = (undefined1  [8])&processed_keys._M_h._M_rehash_policy._M_next_resize;
  processed_keys._M_h._M_buckets = (__buckets_ptr)0x1;
  processed_keys._M_h._M_bucket_count = 0;
  processed_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  processed_keys._M_h._M_element_count._0_4_ = 0x3f800000;
  processed_keys._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  processed_keys._M_h._M_rehash_policy._4_4_ = 0;
  processed_keys._M_h._M_rehash_policy._M_next_resize = 0;
  (local_40->stats).random_access_miss = 0;
  (local_40->stats).k = 0;
  (local_40->stats).num_ranks = 0;
  (local_40->stats).largest_rank = 0;
  (local_40->stats).ordered_access_miss = 0;
  (local_40->stats).random_access_hit = 0;
  (local_40->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_40->stats).ordered_access_hit = 0;
  (local_40->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_40->stats).entries = 0;
  (local_40->topk)._k = local_68;
  (local_40->stats).k = local_68;
  CVar18 = (*(code *)((local_58->_M_impl).super__Vector_impl_data._M_start)->_rank)();
  (pTVar10->stats).num_ranks = CVar18;
  (pTVar10->stats).largest_rank = (Count)local_48;
  (pTVar10->stats).entries = local_70;
  pQVar25 = local_38;
  if ((long)pQVar22 - (long)local_38 != 0) {
    p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
              (((long)pQVar22 - (long)local_38 >> 3) * -0x5555555555555555);
    local_78 = &local_38->_index;
    p_Var24 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
    do {
      pKVar2 = (Key *)((long)pQVar25 + (long)p_Var24 * 0x18);
      pQVar13 = (Queue *)pKVar2[1];
      if (pKVar2[2] <
          (ulong)((*(long *)(pQVar13 + 0x10) - *(long *)(pQVar13 + 8) >> 3) * -0x5555555555555555))
      {
        local_58 = p_Var20;
        local_50 = p_Var24;
        local_48 = pQVar22;
        VVar17 = threshold_algorithm::Queue::head_value(pQVar13);
        *pKVar2 = VVar17;
        pQVar13 = (Queue *)pKVar2[1];
        if (*pQVar13 == (Queue)0x1) {
          __assert_fail("!dirty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/laurolins[P]topkube_benchmark/src/rank.hh"
                        ,0x69,"const Entry &rank::Rank::top(RankSize) const");
        }
        lVar26 = *(long *)(pQVar13 + 8);
        lVar3 = *(long *)(lVar26 + 0x10 + pKVar2[2] * 0x18);
        pKVar2[2] = pKVar2[2] + 1;
        VVar17 = threshold_algorithm::Queue::head_value(pQVar13);
        KVar4 = *pKVar2;
        *pKVar2 = KVar4 - VVar17;
        uVar27 = uVar27 - (KVar4 - VVar17);
        key = *(__node_base_ptr *)(lVar26 + lVar3 * 0x18);
        if (*(long **)((long)local_d8 + ((ulong)key % (ulong)processed_keys._M_h._M_buckets) * 8) !=
            (long *)0x0) {
          plVar5 = (long *)**(long **)((long)local_d8 +
                                      ((ulong)key % (ulong)processed_keys._M_h._M_buckets) * 8);
          p_Var6 = (__node_base_ptr)plVar5[1];
          do {
            if (key == p_Var6) {
              pCVar1 = &(local_40->stats).ordered_access_miss;
              *pCVar1 = *pCVar1 + 1;
              pQVar25 = local_38;
              p_Var24 = local_50;
              pQVar19 = local_48;
              goto LAB_0010dce3;
            }
            plVar5 = (long *)*plVar5;
          } while ((plVar5 != (long *)0x0) &&
                  (p_Var6 = (__node_base_ptr)plVar5[1],
                  (ulong)p_Var6 % (ulong)processed_keys._M_h._M_buckets ==
                  (ulong)key % (ulong)processed_keys._M_h._M_buckets));
        }
        (local_40->stats).ordered_access_hit = (local_40->stats).ordered_access_hit + 1;
        pRVar23 = *(Rank **)(lVar26 + lVar3 * 0x18 + 8);
        bVar28 = local_58 == (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
        p_Var9 = &local_58->_M_impl;
        p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
        p_Var24 = local_50;
        pRVar12 = local_78;
        local_60 = uVar27;
        do {
          if (p_Var24 != p_Var20) {
            VVar17 = rank::Rank::value_of((Rank *)*pRVar12,(Key)key);
            pRVar23 = (Rank *)(&pRVar23->_dirty + VVar17);
            pCVar1 = &(local_40->stats).random_access_hit + (VVar17 == 0);
            *pCVar1 = *pCVar1 + 1;
            p_Var24 = local_50;
          }
          pQVar25 = local_38;
          p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                    ((long)&(p_Var20->_M_impl).super__Vector_impl_data._M_start + 1);
          pRVar12 = pRVar12 + 3;
        } while ((_Vector_base<Queue,_std::allocator<Queue>_> *)
                 ((long)&(p_Var9->super__Vector_impl_data)._M_start + (ulong)bVar28) != p_Var20);
        local_98._key = (Key)local_d8;
        processed_keys._M_h._M_single_bucket = key;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_98._key,&processed_keys._M_h._M_single_bucket,&local_98);
        local_98._key = (Key)key;
        local_98._value = (Value)pRVar23;
        TopK::insert(&local_40->topk,&local_98);
        if (local_68 != 0) {
          pKVar21 = (local_40->topk)._entries.
                    super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pKVar7 = (local_40->topk)._entries.
                   super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar27 = (long)pKVar7 - (long)pKVar21 >> 4;
          for (; pKVar7 != pKVar21; pKVar21 = pKVar21 + 1) {
            uVar27 = uVar27 - (pKVar21->_value < local_60);
          }
          if (local_68 <= uVar27) break;
        }
        p_Var24 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                  ((ulong)((long)&(local_50->_M_impl).super__Vector_impl_data._M_start + 1) %
                  (ulong)local_58);
        pQVar19 = local_48;
        uVar27 = local_60;
      }
      else {
        uVar27 = uVar27 - *pKVar2;
        pQVar19 = (pointer)&pQVar22[-2]._index;
        local_88 = pKVar2[2];
        local_98._key = *pKVar2;
        local_98._value = pKVar2[1];
        pKVar2[2] = pQVar22[-1]._index;
        pRVar23 = pQVar22[-1]._rank;
        *pKVar2 = pQVar22[-2]._index;
        pKVar2[1] = (Key)pRVar23;
        pQVar22[-1]._index = local_88;
        pQVar22[-2]._index = local_98._key;
        pQVar22[-1]._rank = (Rank *)local_98._value;
        if ((_Vector_base<Queue,_std::allocator<Queue>_> *)
            (((long)pQVar19 - (long)pQVar25 >> 3) * -0x5555555555555555) <= p_Var24) {
          p_Var24 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
        }
      }
LAB_0010dce3:
      p_Var20 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                (((long)pQVar19 - (long)pQVar25 >> 3) * -0x5555555555555555);
      pQVar22 = pQVar19;
    } while (p_Var24 < p_Var20);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d8);
  if (pQVar25 != (pointer)0x0) {
    operator_delete(pQVar25);
  }
  return local_40;
}

Assistant:

ThresholdAlgorithmResult threshold_algorithm(const Problem *problem, RankSize k) {

        //
        struct Queue {
            Queue(const Rank* rank): _rank(rank) {};
            bool empty() const { return _index >= _rank->size(); }
            Value head_value() const { return _index < _rank->size() ? _rank->top(_index).value() : 0; }
            Value value_of(Key key) const { return _rank->value_of(key); }
            const Entry* next() {
                if (_index < _rank->size()) {
                    _head_value_drop = head_value();
                    auto &result = _rank->top(_index);
                    ++_index;
                    _head_value_drop -= head_value();
                    return &result;
                }
                else {
                    return nullptr;
                }
            }
            Value head_value_drop() const { return _head_value_drop; }
            Value _head_value_drop { 0 };
            const Rank* _rank;
            RankSize _index { 0 };
        };

        // create m queues
        Count largest_rank = 0;
        Count entries      = 0;
        
        std::vector<Queue> queues;
        Value              head_sum = 0;
        auto m = problem->size();
        queues.reserve(m);
        for (auto i=0;i<m;++i) {
            queues.push_back(Queue(problem->rank(i)));
            if (!queues.back().empty()) {
                head_sum += queues.back().head_value();
                
                auto rank_size = queues.back()._rank->size();
                largest_rank   = std::max(largest_rank, rank_size);
                entries       += rank_size;
                
                
            }
            else {
                queues.pop_back();
            }
        };

        std::unordered_set<Key> processed_keys;

        ThresholdAlgorithmResult result;
        result.topk.k(k);
        auto &topk  = result.topk;
        auto &stats = result.stats;

        stats.k            = k;
        stats.num_ranks    = problem->size();
        stats.largest_rank = largest_rank;
        stats.entries      = entries;

        std::size_t i = 0;
        while (i < queues.size()) {

            // for each queue generate next element
            auto &q = queues.at(i);

            auto top_record  = q.next();
            head_sum        -= q.head_value_drop();

            if ( top_record ) {
                if (!processed_keys.count(top_record->key())) {

                    ++stats.ordered_access_hit;

                    // if key has not beed processed
                    auto record = KeyValue { top_record->key(), top_record->value() };

                    // add all summands to record
                    for (auto j=0;j<queues.size();++j) {
                        if (i != j) {
                            auto value = queues[j].value_of(record.key());
                            record.value_add(value);
                            if (value) {
                                ++stats.random_access_hit;
                            }
                            else {
                                ++stats.random_access_miss;
                            }
                        }
                    }

                    processed_keys.insert(record.key());

                    topk.insert({record.key(), record.value()});

                    if (k && topk.count_entries_above_or_equal(head_sum) >= k) {
                        // proven that we have a valid set of topk entries
                        break;
                    }

                    i = (i + 1) % queues.size();
                }
                else {
                    ++stats.ordered_access_miss;
                }
            }
            else { // queue is emtpy
                std::swap(queues[i], queues.back());
                queues.pop_back();
                if (i >= queues.size()) {
                    i = 0;
                }
            }
        }

        return result;
    
    }